

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mwt.cc
# Opt level: O0

void MWT::predict_or_learn<true,false,true>(mwt *c,single_learner *base,example *ec)

{
  size_t *psVar1;
  bool bVar2;
  cb_class *pcVar3;
  uchar **ppuVar4;
  unsigned_long **ppuVar5;
  policy_data *ppVar6;
  features_value_index_iterator *this;
  ulong *puVar7;
  feature_value *pfVar8;
  size_t sVar9;
  v_array<unsigned_long> *this_00;
  ulong uVar10;
  int __c;
  v_array<unsigned_char> *in_RDX;
  features_value_iterator *rhs;
  long in_RDI;
  float fVar11;
  uint64_t index;
  unsigned_long *__end2;
  unsigned_long *__begin2;
  v_array<unsigned_long> *__range2;
  uchar ns_2;
  v_array<float> preds;
  uint64_t new_index;
  iterator *f;
  iterator __end6;
  iterator __begin6;
  features *__range6;
  uchar ns_1;
  uchar *__end3_2;
  uchar *__begin3_2;
  v_array<unsigned_char> *__range3_2;
  uint64_t weight_mask;
  uint32_t stride_shift;
  uint64_t policy;
  unsigned_long *__end3_1;
  unsigned_long *__begin3_1;
  v_array<unsigned_long> *__range3_1;
  uchar ns;
  uchar *__end3;
  uchar *__begin3;
  v_array<unsigned_char> *__range3;
  parameters *in_stack_fffffffffffffed8;
  features *in_stack_fffffffffffffee0;
  example *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  features *in_stack_fffffffffffffef8;
  size_t *local_f8;
  undefined8 in_stack_ffffffffffffff20;
  uchar *puVar12;
  uint64_t in_stack_ffffffffffffff28;
  size_t sVar13;
  mwt *in_stack_ffffffffffffff30;
  uchar *puVar14;
  features *in_stack_ffffffffffffff38;
  features *__b;
  features *in_stack_ffffffffffffff40;
  features_value_iterator local_b0 [2];
  features_value_index_iterator local_a0;
  long local_90;
  byte local_81;
  byte *local_80;
  byte *local_78;
  v_array<unsigned_char> *local_70;
  uint64_t local_68;
  uint32_t local_5c;
  size_t local_58;
  size_t *local_50;
  size_t *local_48;
  v_array<unsigned_long> *local_40;
  byte local_31;
  byte *local_30;
  byte *local_28;
  v_array<unsigned_char> *local_20;
  v_array<unsigned_char> *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  pcVar3 = get_observed_cost((label *)in_stack_fffffffffffffef8);
  *(cb_class **)(local_8 + 0x120) = pcVar3;
  if (*(long *)(local_8 + 0x120) != 0) {
    *(double *)(local_8 + 0x148) = *(double *)(local_8 + 0x148) + 1.0;
    local_20 = local_18;
    ppuVar4 = v_array<unsigned_char>::begin(local_18);
    local_28 = *ppuVar4;
    ppuVar4 = v_array<unsigned_char>::end(local_20);
    local_30 = *ppuVar4;
    for (; local_28 != local_30; local_28 = local_28 + 1) {
      local_31 = *local_28;
      if ((*(byte *)(local_8 + (ulong)local_31) & 1) != 0) {
        GD::foreach_feature<MWT::mwt,_&MWT::value_policy,_vw_*>
                  ((vw **)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                   in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                   (float)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      }
    }
    local_40 = (v_array<unsigned_long> *)(local_8 + 0x128);
    ppuVar5 = v_array<unsigned_long>::begin(local_40);
    local_48 = *ppuVar5;
    ppuVar5 = v_array<unsigned_long>::end(local_40);
    local_50 = *ppuVar5;
    for (; local_48 != local_50; local_48 = local_48 + 1) {
      local_58 = *local_48;
      in_stack_fffffffffffffee0 = *(features **)(local_8 + 0x120);
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(local_8 + 0x100),local_58);
      fVar11 = CB_ALGS::get_unbiased_cost((cb_class *)in_stack_fffffffffffffee0,ppVar6->action,0.0);
      in_stack_fffffffffffffee8 = (example *)(double)fVar11;
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(local_8 + 0x100),local_58);
      ppVar6->cost = (double)in_stack_fffffffffffffee8 + ppVar6->cost;
      ppVar6 = v_array<MWT::policy_data>::operator[]
                         ((v_array<MWT::policy_data> *)(local_8 + 0x100),local_58);
      ppVar6->action = 0;
    }
  }
  v_array<unsigned_char>::clear((v_array<unsigned_char> *)in_stack_fffffffffffffee0);
  local_5c = parameters::stride_shift(in_stack_fffffffffffffed8);
  local_68 = parameters::mask(in_stack_fffffffffffffed8);
  local_70 = local_18;
  ppuVar4 = v_array<unsigned_char>::begin(local_18);
  local_78 = *ppuVar4;
  ppuVar4 = v_array<unsigned_char>::end(local_70);
  local_80 = *ppuVar4;
  for (; local_78 != local_80; local_78 = local_78 + 1) {
    local_81 = *local_78;
    if ((*(byte *)(local_8 + (ulong)local_81) & 1) != 0) {
      v_array<unsigned_char>::push_back
                ((v_array<unsigned_char> *)in_stack_fffffffffffffee0,
                 &in_stack_fffffffffffffed8->sparse);
      features::clear(in_stack_fffffffffffffee0);
      local_90 = (long)local_18 + (ulong)local_81 * 0x68 + 0x20;
      features::begin(in_stack_fffffffffffffef8);
      features::end(in_stack_fffffffffffffef8);
      while( true ) {
        rhs = local_b0;
        bVar2 = features_value_iterator::operator!=(&local_a0.super_features_value_iterator,rhs);
        if (!bVar2) break;
        this = features_value_index_iterator::operator*(&local_a0);
        puVar7 = (ulong *)features_value_index_iterator::index(this,(char *)rhs,__c);
        in_stack_fffffffffffffed8 =
             (parameters *)
             (((*puVar7 & local_68) >> ((byte)local_5c & 0x3f)) * (ulong)*(uint *)(local_8 + 0x150))
        ;
        pfVar8 = features_value_iterator::value(&this->super_features_value_iterator);
        uVar10 = (ulong)*pfVar8;
        in_stack_ffffffffffffff40 =
             (features *)
             (&in_stack_fffffffffffffed8->sparse +
             (uVar10 | (long)(*pfVar8 - 9.223372e+18) & (long)uVar10 >> 0x3f));
        features::push_back((features *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (feature_value)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                            (feature_index)in_stack_fffffffffffffee0);
        features_value_index_iterator::operator++
                  ((features_value_index_iterator *)in_stack_fffffffffffffee0);
      }
      std::swap<features>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  puVar12 = local_18[0x342].end_array;
  sVar13 = local_18[0x342].erase_count;
  puVar14 = local_18[0x343]._begin;
  __b = (features *)local_18[0x343]._end;
  LEARNER::learner<char,_example>::learn
            ((learner<char,_example> *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
             ,in_stack_fffffffffffffee8,(size_t)in_stack_fffffffffffffee0);
  while (sVar9 = v_array<unsigned_char>::size((v_array<unsigned_char> *)(local_8 + 0x158)),
        sVar9 != 0) {
    v_array<unsigned_char>::pop((v_array<unsigned_char> *)(local_8 + 0x158));
    std::swap<features>(in_stack_ffffffffffffff40,__b);
  }
  v_array<float>::clear(&in_stack_fffffffffffffee0->values);
  v_array<float>::push_back(&in_stack_fffffffffffffee0->values,(float *)in_stack_fffffffffffffed8);
  this_00 = (v_array<unsigned_long> *)(local_8 + 0x128);
  ppuVar5 = v_array<unsigned_long>::begin(this_00);
  local_f8 = *ppuVar5;
  ppuVar5 = v_array<unsigned_long>::end(this_00);
  psVar1 = *ppuVar5;
  for (; local_f8 != psVar1; local_f8 = local_f8 + 1) {
    v_array<MWT::policy_data>::operator[]((v_array<MWT::policy_data> *)(local_8 + 0x100),*local_f8);
    v_array<float>::push_back(&in_stack_fffffffffffffee0->values,(float *)in_stack_fffffffffffffed8)
    ;
  }
  local_18[0x342].end_array = puVar12;
  local_18[0x342].erase_count = sVar13;
  local_18[0x343]._begin = puVar14;
  local_18[0x343]._end = (uchar *)__b;
  return;
}

Assistant:

void predict_or_learn(mwt& c, single_learner& base, example& ec)
{
  c.observation = get_observed_cost(ec.l.cb);

  if (c.observation != nullptr)
  {
    c.total++;
    // For each nonzero feature in observed namespaces, check it's value.
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
        GD::foreach_feature<mwt, value_policy>(c.all, ec.feature_space[ns], c);
    for (uint64_t policy : c.policies)
    {
      c.evals[policy].cost += get_unbiased_cost(c.observation, c.evals[policy].action);
      c.evals[policy].action = 0;
    }
  }
  if (exclude || learn)
  {
    c.indices.clear();
    uint32_t stride_shift = c.all->weights.stride_shift();
    uint64_t weight_mask = c.all->weights.mask();
    for (unsigned char ns : ec.indices)
      if (c.namespaces[ns])
      {
        c.indices.push_back(ns);
        if (learn)
        {
          c.feature_space[ns].clear();
          for (features::iterator& f : ec.feature_space[ns])
          {
            uint64_t new_index = ((f.index() & weight_mask) >> stride_shift) * c.num_classes + (uint64_t)f.value();
            c.feature_space[ns].push_back(1, new_index << stride_shift);
          }
        }
        std::swap(c.feature_space[ns], ec.feature_space[ns]);
      }
  }

  // modify the predictions to use a vector with a score for each evaluated feature.
  v_array<float> preds = ec.pred.scalars;

  if (learn)
  {
    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);
  }

  if (exclude || learn)
    while (c.indices.size() > 0)
    {
      unsigned char ns = c.indices.pop();
      swap(c.feature_space[ns], ec.feature_space[ns]);
    }

  // modify the predictions to use a vector with a score for each evaluated feature.
  preds.clear();
  if (learn)
    preds.push_back((float)ec.pred.multiclass);
  for (uint64_t index : c.policies) preds.push_back((float)c.evals[index].cost / (float)c.total);

  ec.pred.scalars = preds;
}